

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronous_factory.h
# Opt level: O2

shared_ptr<spdlog::logger>
spdlog::synchronous_factory::
create<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,spdlog::color_mode&>
          (string *logger_name,color_mode *args)

{
  registry *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::logger> sVar1;
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_> sink;
  __shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  color_mode local_28 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::
  make_shared<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,spdlog::color_mode&>
            (local_28);
  std::
  make_shared<spdlog::logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>>
            (logger_name,
             (shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_> *)
             args);
  this = details::registry::instance();
  std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,(__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)logger_name);
  details::registry::initialize_logger(this,(shared_ptr<spdlog::logger> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)logger_name;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<spdlog::logger> create(std::string logger_name, SinkArgs &&...args) {
        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<spdlog::logger>(std::move(logger_name), std::move(sink));
        details::registry::instance().initialize_logger(new_logger);
        return new_logger;
    }